

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_datagram_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  ptls_iovec_t pVar1;
  int iVar2;
  uint64_t in_RSI;
  st_quicly_conn_t *in_RDI;
  quicly_conn_t *_conn;
  int ret;
  quicly_datagram_frame_t frame;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t *in_stack_ffffffffffffffd8;
  uint8_t **in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((((in_RDI->super).ctx)->transport_params).max_datagram_frame_size == 0) {
    local_4 = 0x20007;
  }
  else {
    local_4 = quicly_decode_datagram_frame
                        (in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                         (quicly_datagram_frame_t *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (local_4 == 0) {
      if ((quicly_trace_fp != (FILE *)0x0) &&
         (iVar2 = ptls_skip_tracing((in_RDI->crypto).tls), iVar2 == 0)) {
        QUICLY_DATAGRAM_RECEIVE
                  (in_RDI,in_RSI,in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8);
      }
      pVar1.len = (size_t)in_stack_ffffffffffffffe0;
      pVar1.base = in_stack_ffffffffffffffd8;
      (*((in_RDI->super).ctx)->receive_datagram_frame->cb)
                (((in_RDI->super).ctx)->receive_datagram_frame,in_RDI,pVar1);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int handle_datagram_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_datagram_frame_t frame;
    int ret;

    /* check if we advertised support for DATAGRAM frames on this connection */
    if (conn->super.ctx->transport_params.max_datagram_frame_size == 0)
        return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;

    /* decode the frame */
    if ((ret = quicly_decode_datagram_frame(state->frame_type, &state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(DATAGRAM_RECEIVE, conn, conn->stash.now, frame.payload.base, frame.payload.len);

    /* handle the frame. Applications might call quicly_close or other functions that modify the connection state. */
    conn->super.ctx->receive_datagram_frame->cb(conn->super.ctx->receive_datagram_frame, conn, frame.payload);

    return 0;
}